

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Status_set_elements_x(MPIABI_Status *status,MPIABI_Datatype datatype,MPIABI_Count count)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Status_set_elements_x();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Status_set_elements_x(
  MPIABI_Status * status,
  MPIABI_Datatype datatype,
  MPIABI_Count count
) {
  return MPI_Status_set_elements_x(
    (MPI_Status *)(WPI_StatusPtr)status,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Count)(WPI_Count)count
  );
}